

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate_policies_unittest.cc
# Opt level: O1

void __thiscall
bssl::(anonymous_namespace)::
ParseCertificatePoliciesExtensionOidsTest_InvalidPolicyInformationHasUnconsumedData_Test::
~ParseCertificatePoliciesExtensionOidsTest_InvalidPolicyInformationHasUnconsumedData_Test
          (ParseCertificatePoliciesExtensionOidsTest_InvalidPolicyInformationHasUnconsumedData_Test
           *this)

{
  testing::Test::~Test((Test *)(this + -0x10));
  operator_delete((Test *)(this + -0x10),0x18);
  return;
}

Assistant:

TEST_P(ParseCertificatePoliciesExtensionOidsTest,
       InvalidPolicyInformationHasUnconsumedData) {
  std::string der;
  ASSERT_TRUE(LoadTestData(
      "invalid-policy_1_2_3_policyinformation_unconsumed_data.pem", &der));
  std::vector<der::Input> policies;
  CertErrors errors;
  EXPECT_FALSE(ParseCertificatePoliciesExtensionOids(
      StringAsBytes(der), fail_parsing_unknown_qualifier_oids(), &policies,
      &errors));
}